

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_workspace.cpp
# Opt level: O3

void __thiscall ON_Workspace::KeepAllMemory(ON_Workspace *this)

{
  ON_Workspace_MBLK *memblock;
  ON_Workspace_MBLK *pOVar1;
  
  memblock = this->m_pMemBlk;
  this->m_pMemBlk = (ON_Workspace_MBLK *)0x0;
  while (memblock != (ON_Workspace_MBLK *)0x0) {
    pOVar1 = memblock->pNext;
    memblock->pMem = (void *)0x0;
    onfree(memblock);
    memblock = pOVar1;
  }
  return;
}

Assistant:

void ON_Workspace::KeepAllMemory()
{
  struct ON_Workspace_MBLK* p;
  struct ON_Workspace_MBLK* pNext = m_pMemBlk;
  m_pMemBlk = 0;
  while ( pNext )
  {
    p = pNext;
    pNext = pNext->pNext;
    p->pMem = 0; // caller want to manage this heap
    onfree( p );
  }
}